

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Clip_x86_avx::forward_inplace(Clip_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  _func_int **pp_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  uint uVar6;
  long lVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    pp_Var3 = this->_vptr_Clip_x86_avx;
    lVar8 = 0;
    do {
      pauVar9 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar6 < 8) {
        uVar11 = 0;
      }
      else {
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
        auVar14._4_4_ = uVar1;
        auVar14._0_4_ = uVar1;
        auVar14._8_4_ = uVar1;
        auVar14._12_4_ = uVar1;
        auVar14._16_4_ = uVar1;
        auVar14._20_4_ = uVar1;
        auVar14._24_4_ = uVar1;
        auVar14._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var3[-3]);
        auVar16._4_4_ = uVar1;
        auVar16._0_4_ = uVar1;
        auVar16._8_4_ = uVar1;
        auVar16._12_4_ = uVar1;
        auVar16._16_4_ = uVar1;
        auVar16._20_4_ = uVar1;
        auVar16._24_4_ = uVar1;
        auVar16._28_4_ = uVar1;
        iVar10 = 7;
        do {
          auVar5 = vmaxps_avx(auVar14,*pauVar9);
          auVar5 = vminps_avx(auVar5,auVar16);
          *pauVar9 = auVar5;
          pauVar9 = pauVar9 + 1;
          iVar10 = iVar10 + 8;
          uVar11 = uVar6 & 0xfffffff8;
        } while (iVar10 < (int)uVar6);
      }
      if ((int)(uVar11 | 3) < (int)uVar6) {
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
        auVar13._4_4_ = uVar1;
        auVar13._0_4_ = uVar1;
        auVar13._8_4_ = uVar1;
        auVar13._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var3[-3]);
        auVar15._4_4_ = uVar1;
        auVar15._0_4_ = uVar1;
        auVar15._8_4_ = uVar1;
        auVar15._12_4_ = uVar1;
        uVar12 = uVar11;
        do {
          auVar4 = vmaxps_avx(auVar13,*(undefined1 (*) [16])*pauVar9);
          auVar4 = vminps_avx(auVar4,auVar15);
          *(undefined1 (*) [16])*pauVar9 = auVar4;
          pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
          uVar11 = uVar12 + 4;
          iVar10 = uVar12 + 7;
          uVar12 = uVar11;
        } while (iVar10 < (int)uVar6);
      }
      if (uVar6 - uVar11 != 0 && (int)uVar11 <= (int)uVar6) {
        lVar7 = 0;
        do {
          if (*(float *)(*pauVar9 + lVar7 * 4) < *(float *)(&this->field_0xd0 + (long)pp_Var3[-3]))
          {
            *(float *)(*pauVar9 + lVar7 * 4) = *(float *)(&this->field_0xd0 + (long)pp_Var3[-3]);
          }
          if (*(float *)(&this->field_0xd4 + (long)pp_Var3[-3]) < *(float *)(*pauVar9 + lVar7 * 4))
          {
            *(float *)(*pauVar9 + lVar7 * 4) = *(float *)(&this->field_0xd4 + (long)pp_Var3[-3]);
          }
          lVar7 = lVar7 + 1;
        } while (uVar6 - uVar11 != (int)lVar7);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar2);
  }
  return 0;
}

Assistant:

int Clip_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}